

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O2

void __thiscall
testing::internal::UnorderedElementsAreMatcherImplBase::DescribeToImpl
          (UnorderedElementsAreMatcherImplBase *this,ostream *os)

{
  long lVar1;
  long *plVar2;
  ostream *poVar3;
  char *pcVar4;
  size_t i;
  long lVar5;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_38;
  
  lVar5 = *(long *)this;
  lVar1 = *(long *)&this->field_0x8;
  if (lVar5 != lVar1) {
    poVar3 = std::operator<<(os,"has ");
    if (lVar1 - lVar5 == 8) {
      Elements((UnorderedElementsAreMatcherImplBase *)&sStack_38,1);
      poVar3 = testing::operator<<(poVar3,(Message *)&sStack_38);
      std::operator<<(poVar3," and that element ");
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&sStack_38);
      (**(code **)(*(long *)**(undefined8 **)this + 0x10))((long *)**(undefined8 **)this,os);
    }
    else {
      Elements((UnorderedElementsAreMatcherImplBase *)&sStack_38,
               *(long *)&this->field_0x8 - *(long *)this >> 3);
      poVar3 = testing::operator<<(poVar3,(Message *)&sStack_38);
      std::operator<<(poVar3," and there exists some permutation of elements such that:\n");
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&sStack_38);
      pcVar4 = "";
      for (lVar5 = 0; lVar5 != *(long *)&this->field_0x8 - *(long *)this >> 3; lVar5 = lVar5 + 1) {
        poVar3 = std::operator<<(os,pcVar4);
        poVar3 = std::operator<<(poVar3," - element #");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::operator<<(poVar3," ");
        plVar2 = *(long **)(*(long *)this + lVar5 * 8);
        (**(code **)(*plVar2 + 0x10))(plVar2,os);
        pcVar4 = ", and\n";
      }
    }
    return;
  }
  std::operator<<(os,"is empty");
  return;
}

Assistant:

void UnorderedElementsAreMatcherImplBase::DescribeToImpl(
    ::std::ostream* os) const {
  if (matcher_describers_.empty()) {
    *os << "is empty";
    return;
  }
  if (matcher_describers_.size() == 1) {
    *os << "has " << Elements(1) << " and that element ";
    matcher_describers_[0]->DescribeTo(os);
    return;
  }
  *os << "has " << Elements(matcher_describers_.size())
      << " and there exists some permutation of elements such that:\n";
  const char* sep = "";
  for (size_t i = 0; i != matcher_describers_.size(); ++i) {
    *os << sep << " - element #" << i << " ";
    matcher_describers_[i]->DescribeTo(os);
    sep = ", and\n";
  }
}